

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

void __thiscall
helics::apps::Source::Source
          (Source *this,string_view appName,shared_ptr<helics::Core> *core,FederateInfo *fedInfo)

{
  string_view appName_00;
  App *in_RCX;
  FederateInfo *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  shared_ptr<helics::Core> *in_R8;
  undefined8 *t;
  Source *this_00;
  
  appName_00._M_str = in_RSI;
  appName_00._M_len = (size_t)in_RDI;
  App::App(in_RCX,appName_00,in_R8,in_RDX);
  *in_RDI = &PTR__Source_009be350;
  CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::deque
            ((deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *)
             0x23602e);
  t = in_RDI + 0x1e;
  CLI::std::
  vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
  ::vector((vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
            *)0x236045);
  this_00 = (Source *)(in_RDI + 0x21);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x23605b);
  CLI::std::vector<helics::Endpoint,_std::allocator<helics::Endpoint>_>::vector
            ((vector<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x236071);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x236087);
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)this_00,(double)t);
  initialSetup(this_00);
  return;
}

Assistant:

Source::Source(std::string_view appName,
                   const std::shared_ptr<Core>& core,
                   const FederateInfo& fedInfo): App(appName, core, fedInfo)
    {
        initialSetup();
    }